

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall
nn::ESoinn::initialize
          (ESoinn *this,pair<wv::AbstractWeightVector_*,_wv::AbstractWeightVector_*> *points,
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *src_label)

{
  long *plVar1;
  ConcreteLogger *pCVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  WeightVectorPhrase *pWVar7;
  WeightVectorPhrase *this_00;
  allocator local_249;
  string local_248;
  string local_228;
  ESoinnNeuron local_208;
  string local_180;
  ESoinnNeuron local_160;
  WeightVectorPhrase *local_d8;
  WeightVectorPhrase *sWeightVector2;
  WeightVectorPhrase *sWeightVector1;
  uint local_a4;
  string local_a0 [4];
  uint32_t i_1;
  uint local_7c;
  undefined1 local_78 [4];
  uint32_t i;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  coords2;
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  coords1;
  allocator local_41;
  string local_40;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_20;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *src_label_local;
  pair<wv::AbstractWeightVector_*,_wv::AbstractWeightVector_*> *points_local;
  ESoinn *this_local;
  
  pCVar2 = log_netw;
  local_20 = src_label;
  src_label_local =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)points;
  points_local = (pair<wv::AbstractWeightVector_*,_wv::AbstractWeightVector_*> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"Initialize network",&local_41);
  logger::ConcreteLogger::debug(pCVar2,&local_40,false);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  uVar4 = (**(code **)(**(long **)&src_label_local->first + 0x18))();
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&coords2.m_Size,uVar4);
  uVar4 = (**(code **)(*(long *)(src_label_local->first)._M_string_length + 0x18))();
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_78,uVar4);
  local_7c = 0;
  while( true ) {
    uVar3 = local_7c;
    uVar5 = (**(code **)(**(long **)&src_label_local->first + 0x18))();
    if (uVar5 <= uVar3) break;
    (**(code **)(**(long **)&src_label_local->first + 0x10))
              (local_a0,*(long **)&src_label_local->first,local_7c);
    pbVar6 = cont::
             StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&coords2.m_Size,local_7c);
    std::__cxx11::string::operator=((string *)pbVar6,local_a0);
    std::__cxx11::string::~string(local_a0);
    local_7c = local_7c + 1;
  }
  local_a4 = 0;
  while( true ) {
    uVar3 = local_a4;
    uVar5 = (**(code **)(*(long *)(src_label_local->first)._M_string_length + 0x18))();
    if (uVar5 <= uVar3) break;
    plVar1 = (long *)(src_label_local->first)._M_string_length;
    (**(code **)(*plVar1 + 0x10))(&sWeightVector1,plVar1,local_a4);
    pbVar6 = cont::
             StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)local_78,local_a4);
    std::__cxx11::string::operator=((string *)pbVar6,(string *)&sWeightVector1);
    std::__cxx11::string::~string((string *)&sWeightVector1);
    local_a4 = local_a4 + 1;
  }
  pWVar7 = (WeightVectorPhrase *)operator_new(0x20);
  wv::WeightVectorPhrase::WeightVectorPhrase
            (pWVar7,(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&coords2.m_Size,this->m_Distances);
  sWeightVector2 = pWVar7;
  this_00 = (WeightVectorPhrase *)operator_new(0x20);
  wv::WeightVectorPhrase::WeightVectorPhrase
            (this_00,(StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_78,this->m_Distances);
  pWVar7 = sWeightVector2;
  local_d8 = this_00;
  std::__cxx11::string::string((string *)&local_180,(string *)local_20);
  neuron::ESoinnNeuron::ESoinnNeuron(&local_160,&pWVar7->super_AbstractWeightVector,&local_180);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::push_back
            (&this->m_Neurons,&local_160);
  neuron::ESoinnNeuron::~ESoinnNeuron(&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  pWVar7 = local_d8;
  std::__cxx11::string::string((string *)&local_228,(string *)&local_20->second);
  neuron::ESoinnNeuron::ESoinnNeuron(&local_208,&pWVar7->super_AbstractWeightVector,&local_228);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::push_back
            (&this->m_Neurons,&local_208);
  neuron::ESoinnNeuron::~ESoinnNeuron(&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  pCVar2 = log_netw;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_248,"Network is successfully initialized",&local_249);
  logger::ConcreteLogger::debug(pCVar2,&local_248,false);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator((allocator<char> *)&local_249);
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_78);
  cont::
  StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~StaticArray((StaticArray<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&coords2.m_Size);
  return;
}

Assistant:

void ESoinn::initialize(const std::pair<wv::Point*, wv::Point*>& points, const std::pair<std::string, std::string>& src_label)
    {
        log_netw->debug("Initialize network");
        //if (m_NumDimensions != points.first->getNumDimensions())
        //    throw std::runtime_error("Number of dimensions for data doesn't correspond dimension of neural network");
        cont::StaticArray<std::string> coords1(points.first->getNumDimensions());
        cont::StaticArray<std::string> coords2(points.second->getNumDimensions());

        for (uint32_t i = 0; i < points.first->getNumDimensions(); i++)
        {
            coords1[i] = points.first->getConcreteCoord(i);
        }
        
        for (uint32_t i = 0; i < points.second->getNumDimensions(); i++)
        {
            coords2[i] = points.second->getConcreteCoord(i);
        }
        
        wv::WeightVectorPhrase* sWeightVector1 = new wv::WeightVectorPhrase(coords1, m_Distances);
        wv::WeightVectorPhrase* sWeightVector2 = new wv::WeightVectorPhrase(coords2, m_Distances);
        m_Neurons.push_back(neuron::ESoinnNeuron(sWeightVector1, src_label.first));
        m_Neurons.push_back(neuron::ESoinnNeuron(sWeightVector2, src_label.second));
        
        log_netw->debug("Network is successfully initialized");
    }